

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O0

void DrawerCommandQueue::QueueCommand<swrenderer::DrawFuzzColumnPalCommand>(void)

{
  DrawFuzzColumnPalCommand *pDVar1;
  bool bVar2;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  DrawFuzzColumnPalCommand *local_70;
  DrawFuzzColumnPalCommand *local_68;
  DrawFuzzColumnPalCommand *command_1;
  void *ptr;
  _lambda_void__char_const__bool__1_ local_42;
  _lambda_void___1_ local_41;
  undefined1 local_40 [8];
  DrawFuzzColumnPalCommand command;
  DrawerCommandQueue *queue;
  
  command._40_8_ = Instance();
  if ((((DrawerCommandQueue *)command._40_8_)->threaded_render == 0) ||
     (bVar2 = FBoolCVar::operator_cast_to_bool(&r_multithreaded), !bVar2)) {
    swrenderer::DrawFuzzColumnPalCommand::DrawFuzzColumnPalCommand
              ((DrawFuzzColumnPalCommand *)local_40);
    tryBlock = QueueCommand()::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_41);
    catchBlock = QueueCommand()::{lambda(void*,char_const*,bool)#1}::
                 operator_cast_to_function_pointer(&local_42);
    VectoredTryCatch((DrawFuzzColumnPalCommand *)local_40,tryBlock,catchBlock);
    swrenderer::DrawFuzzColumnPalCommand::~DrawFuzzColumnPalCommand
              ((DrawFuzzColumnPalCommand *)local_40);
  }
  else {
    command_1 = (DrawFuzzColumnPalCommand *)AllocMemory(0x30);
    if (command_1 == (DrawFuzzColumnPalCommand *)0x0) {
      Finish((DrawerCommandQueue *)command._40_8_);
      command_1 = (DrawFuzzColumnPalCommand *)AllocMemory(0x30);
      if (command_1 == (DrawFuzzColumnPalCommand *)0x0) {
        return;
      }
    }
    pDVar1 = command_1;
    swrenderer::DrawFuzzColumnPalCommand::DrawFuzzColumnPalCommand(command_1);
    local_68 = pDVar1;
    local_70 = pDVar1;
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::push_back
              ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (Instance::queue.memorypool + command._40_8_ + 0x599518),(value_type *)&local_70);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}